

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O0

int __thiscall
CNet::GetWires3D(CNet *this,vector<CWire_*,_std::allocator<CWire_*>_> *pWires,CPoint *pPoint,
                int iMode,int iValue)

{
  bool bVar1;
  uint uVar2;
  reference ppCVar3;
  reference ppCVar4;
  size_type sVar5;
  uint local_104;
  iterator iStack_100;
  int iRet_1;
  CWire **local_f8;
  __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_> local_f0;
  __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_> local_e8;
  CWire *local_e0;
  CWire *pWire_1;
  iterator end_1;
  iterator itr_1;
  undefined1 local_b8 [8];
  deque<CPoint_*,_std::allocator<CPoint_*>_> Queue;
  iterator iStack_60;
  int iRet;
  CWire **local_58;
  __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_> local_50;
  __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_> local_48;
  CWire *local_40;
  CWire *pWire;
  iterator end;
  iterator itr;
  int iValue_local;
  int iMode_local;
  CPoint *pPoint_local;
  vector<CWire_*,_std::allocator<CWire_*>_> *pWires_local;
  CNet *this_local;
  
  _iValue_local = pPoint;
  pPoint_local = (CPoint *)pWires;
  pWires_local = (vector<CWire_*,_std::allocator<CWire_*>_> *)this;
  if (pPoint == (CPoint *)0x0) {
    end = std::vector<CWire_*,_std::allocator<CWire_*>_>::begin(&this->m_Wire);
    pWire = (CWire *)std::vector<CWire_*,_std::allocator<CWire_*>_>::end(&this->m_Wire);
    while (bVar1 = __gnu_cxx::operator!=
                             (&end,(__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>
                                    *)&pWire), bVar1) {
      ppCVar3 = __gnu_cxx::
                __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
                operator*(&end);
      local_40 = *ppCVar3;
      local_50._M_current =
           (CWire **)
           std::vector<CWire_*,_std::allocator<CWire_*>_>::begin
                     ((vector<CWire_*,_std::allocator<CWire_*>_> *)pPoint_local);
      local_58 = (CWire **)
                 std::vector<CWire_*,_std::allocator<CWire_*>_>::end
                           ((vector<CWire_*,_std::allocator<CWire_*>_> *)pPoint_local);
      local_48 = std::
                 find<__gnu_cxx::__normal_iterator<CWire**,std::vector<CWire*,std::allocator<CWire*>>>,CWire*>
                           (local_50,(__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>
                                      )local_58,&local_40);
      iStack_60 = std::vector<CWire_*,_std::allocator<CWire_*>_>::end
                            ((vector<CWire_*,_std::allocator<CWire_*>_> *)pPoint_local);
      bVar1 = __gnu_cxx::operator==(&local_48,&stack0xffffffffffffffa0);
      if (!bVar1) {
        __assert_fail("find(pWires->begin(),pWires->end(),pWire)==pWires->end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                      ,900,"int CNet::GetWires3D(vector<CWire *> *, CPoint *, int, int)");
      }
      Queue.super__Deque_base<CPoint_*,_std::allocator<CPoint_*>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_node._4_4_ = 0;
      if (iMode == 0) {
        uVar2 = CObject::GetProp(&local_40->super_CObject);
        if ((uVar2 & iValue) != 0) {
          std::vector<CWire_*,_std::allocator<CWire_*>_>::push_back
                    ((vector<CWire_*,_std::allocator<CWire_*>_> *)pPoint_local,&local_40);
        }
      }
      else {
        if (iMode != 1) {
          __assert_fail("FALSE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                        ,0x38f,"int CNet::GetWires3D(vector<CWire *> *, CPoint *, int, int)");
        }
        uVar2 = CObject::GetState(&local_40->super_CObject);
        if ((uVar2 & iValue) != 0) {
          std::vector<CWire_*,_std::allocator<CWire_*>_>::push_back
                    ((vector<CWire_*,_std::allocator<CWire_*>_> *)pPoint_local,&local_40);
        }
      }
      __gnu_cxx::__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
      operator++(&end);
    }
  }
  else {
    std::deque<CPoint_*,_std::allocator<CPoint_*>_>::deque
              ((deque<CPoint_*,_std::allocator<CPoint_*>_> *)local_b8);
    std::deque<CPoint_*,_std::allocator<CPoint_*>_>::push_front
              ((deque<CPoint_*,_std::allocator<CPoint_*>_> *)local_b8,(value_type *)&iValue_local);
    while (bVar1 = std::deque<CPoint_*,_std::allocator<CPoint_*>_>::empty
                             ((deque<CPoint_*,_std::allocator<CPoint_*>_> *)local_b8),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      ppCVar4 = std::deque<CPoint_*,_std::allocator<CPoint_*>_>::front
                          ((deque<CPoint_*,_std::allocator<CPoint_*>_> *)local_b8);
      _iValue_local = *ppCVar4;
      std::deque<CPoint_*,_std::allocator<CPoint_*>_>::pop_front
                ((deque<CPoint_*,_std::allocator<CPoint_*>_> *)local_b8);
      end_1 = std::vector<CWire_*,_std::allocator<CWire_*>_>::begin(&this->m_Wire);
      pWire_1 = (CWire *)std::vector<CWire_*,_std::allocator<CWire_*>_>::end(&this->m_Wire);
      while (bVar1 = __gnu_cxx::operator!=
                               (&end_1,(__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>
                                        *)&pWire_1), bVar1) {
        ppCVar3 = __gnu_cxx::
                  __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
                  operator*(&end_1);
        local_e0 = *ppCVar3;
        local_f0._M_current =
             (CWire **)
             std::vector<CWire_*,_std::allocator<CWire_*>_>::begin
                       ((vector<CWire_*,_std::allocator<CWire_*>_> *)pPoint_local);
        local_f8 = (CWire **)
                   std::vector<CWire_*,_std::allocator<CWire_*>_>::end
                             ((vector<CWire_*,_std::allocator<CWire_*>_> *)pPoint_local);
        local_e8 = std::
                   find<__gnu_cxx::__normal_iterator<CWire**,std::vector<CWire*,std::allocator<CWire*>>>,CWire*>
                             (local_f0,(__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>
                                        )local_f8,&local_e0);
        iStack_100 = std::vector<CWire_*,_std::allocator<CWire_*>_>::end
                               ((vector<CWire_*,_std::allocator<CWire_*>_> *)pPoint_local);
        bVar1 = __gnu_cxx::operator!=(&local_e8,&stack0xffffffffffffff00);
        if (!bVar1) {
          local_104 = 0;
          if (iMode == 0) {
            uVar2 = CObject::GetProp(&local_e0->super_CObject);
            if ((uVar2 & iValue) != 0) {
              local_104 = CWire::IsOn3D(local_e0,_iValue_local);
            }
          }
          else {
            if (iMode != 1) {
              __assert_fail("FALSE",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                            ,0x3ac,"int CNet::GetWires3D(vector<CWire *> *, CPoint *, int, int)");
            }
            uVar2 = CObject::GetState(&local_e0->super_CObject);
            if ((uVar2 & iValue) != 0) {
              local_104 = CWire::IsOn3D(local_e0,_iValue_local);
            }
          }
          if ((local_104 & 3) != 0) {
            std::vector<CWire_*,_std::allocator<CWire_*>_>::push_back
                      ((vector<CWire_*,_std::allocator<CWire_*>_> *)pPoint_local,&local_e0);
          }
          if ((local_104 & 2) != 0) {
            std::deque<CPoint_*,_std::allocator<CPoint_*>_>::push_front
                      ((deque<CPoint_*,_std::allocator<CPoint_*>_> *)local_b8,&local_e0->m_pPointS);
          }
          if ((local_104 & 1) != 0) {
            std::deque<CPoint_*,_std::allocator<CPoint_*>_>::push_front
                      ((deque<CPoint_*,_std::allocator<CPoint_*>_> *)local_b8,&local_e0->m_pPointE);
          }
        }
        __gnu_cxx::__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
        operator++(&end_1);
      }
    }
    std::deque<CPoint_*,_std::allocator<CPoint_*>_>::~deque
              ((deque<CPoint_*,_std::allocator<CPoint_*>_> *)local_b8);
  }
  sVar5 = std::vector<CWire_*,_std::allocator<CWire_*>_>::size
                    ((vector<CWire_*,_std::allocator<CWire_*>_> *)pPoint_local);
  return (int)sVar5;
}

Assistant:

int CNet::GetWires3D(vector<CWire*>* pWires, CPoint* pPoint, int iMode, int iValue)
{
	if(!pPoint)
	{
		for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
		{
			CWire*	pWire	=	*itr;
			assert(find(pWires->begin(),pWires->end(),pWire)==pWires->end());

			int	iRet	=	RET_WIRE_NONE;
			switch(iMode) {
			case GET_MODE_PROP:
				if(pWire->GetProp()&iValue)		pWires->push_back(pWire);
				break;
			case GET_MODE_STATE:
				if(pWire->GetState()&iValue)	pWires->push_back(pWire);
				break;
			default:
				assert(FALSE);
				break;
			}
		}
	}
	else
	{
		deque<CPoint*> Queue;
		
		Queue.push_front(pPoint);
		
		while(!Queue.empty())
		{
			pPoint	=	Queue.front();Queue.pop_front();
			for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
			{
				CWire*	pWire	=	*itr;

				if(find(pWires->begin(),pWires->end(),pWire)!=pWires->end())	continue;
				
				int	iRet	=	RET_WIRE_NONE;
				switch(iMode) {
				case GET_MODE_PROP:
					if(pWire->GetProp()&iValue)		iRet	=	pWire->IsOn3D(pPoint);
					break;
				case GET_MODE_STATE:
					if(pWire->GetState()&iValue)	iRet	=	pWire->IsOn3D(pPoint);
					break;
				default:
					assert(FALSE);
					break;
				}
				
				if(iRet&RET_WIRE_SE)	pWires->push_back(pWire);
				if(iRet&RET_WIRE_E)		Queue.push_front(pWire->m_pPointS);				
				if(iRet&RET_WIRE_S)		Queue.push_front(pWire->m_pPointE);
			}
		}
	}
	return	pWires->size();
}